

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decPrint.c
# Opt level: O1

void Dec_GraphPrint(FILE *pFile,Dec_Graph_t *pGraph,char **pNamesIn,char *pNameOut)

{
  Dec_Edge_t DVar1;
  int in_EAX;
  Vec_Ptr_t *vNames;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  undefined8 uStack_38;
  int iStack_34;
  
  if (pNamesIn == (char **)0x0) {
    vNames = Abc_NodeGetFakeNames(pGraph->nLeaves);
    pNamesIn = (char **)vNames->pArray;
  }
  else {
    vNames = (Vec_Ptr_t *)0x0;
  }
  pcVar3 = "F";
  if (pNameOut != (char *)0x0) {
    pcVar3 = pNameOut;
  }
  uVar4 = pGraph->nLeaves;
  if (0 < (long)(int)uVar4) {
    lVar2 = 0;
    do {
      lVar2 = lVar2 + 1;
    } while ((int)uVar4 != lVar2);
  }
  if (pGraph->fConst == 0) {
    DVar1 = pGraph->eRoot;
    fprintf((FILE *)pFile,"%6s = ",pcVar3);
    uStack_38 = CONCAT44(10,in_EAX);
    if (((uint)DVar1 >> 1 & 0x3fffffff) < uVar4) {
      uVar4 = (uint)pGraph->eRoot >> 1 & 0x3fffffff;
      if ((uint)pGraph->nLeaves <= uVar4) {
        __assert_fail("Dec_GraphIsVar( pGraph )",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/dec/dec.h"
                      ,0x218,"int Dec_GraphVarInt(Dec_Graph_t *)");
      }
      Dec_GraphPrintGetLeafName(pFile,uVar4,(uint)pGraph->eRoot & 1,pNamesIn);
    }
    else {
      Dec_GraphPrint_rec(pFile,pGraph,pGraph->pNodes + (long)pGraph->nSize + -1,
                         (uint)pGraph->eRoot & 1,pNamesIn,&iStack_34,in_EAX);
    }
  }
  else {
    fprintf((FILE *)pFile,"%6s = ",pcVar3);
    uStack_38 = CONCAT44(10,in_EAX);
    fprintf((FILE *)pFile,"Constant %d",(ulong)(~(uint)pGraph->eRoot & 1));
  }
  fputc(10,(FILE *)pFile);
  if (vNames != (Vec_Ptr_t *)0x0) {
    Abc_NodeFreeNames(vNames);
  }
  return;
}

Assistant:

void Dec_GraphPrint( FILE * pFile, Dec_Graph_t * pGraph, char * pNamesIn[], char * pNameOut )
{
    Vec_Ptr_t * vNamesIn = NULL;
    int LitSizeMax, LitSizeCur, Pos, i;

    // create the names if not given by the user
    if ( pNamesIn == NULL )
    {
        vNamesIn = Abc_NodeGetFakeNames( Dec_GraphLeaveNum(pGraph) );
        pNamesIn = (char **)vNamesIn->pArray;
    }
    if ( pNameOut == NULL )
        pNameOut = "F";

    // get the size of the longest literal
    LitSizeMax = 0;
    for ( i = 0; i < Dec_GraphLeaveNum(pGraph); i++ )
    {
        LitSizeCur = strlen(pNamesIn[i]);
        if ( LitSizeMax < LitSizeCur )
            LitSizeMax = LitSizeCur;
    }
    if ( LitSizeMax > 50 )
        LitSizeMax = 20;

    // write the decomposition graph (factored form)
    if ( Dec_GraphIsConst(pGraph) ) // constant
    {
        Pos = Dec_GraphPrintOutputName( pFile, pNameOut );
        fprintf( pFile, "Constant %d", !Dec_GraphIsComplement(pGraph) );
    }
    else if ( Dec_GraphIsVar(pGraph) ) // literal
    {
        Pos = Dec_GraphPrintOutputName( pFile, pNameOut );
        Dec_GraphPrintGetLeafName( pFile, Dec_GraphVarInt(pGraph), Dec_GraphIsComplement(pGraph), pNamesIn );
    }
    else
    {
        Pos = Dec_GraphPrintOutputName( pFile, pNameOut );
        Dec_GraphPrint_rec( pFile, pGraph, Dec_GraphNodeLast(pGraph), Dec_GraphIsComplement(pGraph), pNamesIn, &Pos, LitSizeMax );
    }
    fprintf( pFile, "\n" );

    if ( vNamesIn )
        Abc_NodeFreeNames( vNamesIn );
}